

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O1

ion_err_t ion_delete_dictionary(ion_dictionary_t *dictionary,ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  ulong uVar2;
  ion_dictionary_handler_t *config;
  ion_dictionary_handler_t handler;
  ion_dictionary_config_info_t blank;
  ion_dictionary_handler_t local_88;
  ion_dictionary_config_info_t local_38;
  
  config = &local_88;
  if (dictionary->status == '\x01') {
    uVar2 = (ulong)id;
    local_88.insert =
         (_func_ion_status_t_ion_dictionary_t_ptr_ion_key_t_ion_value_t *)
         CONCAT44(local_88.insert._4_4_,id);
    iVar1 = ion_master_table_read((ion_dictionary_config_info_t *)&local_88,-1);
    if ((ion_dictionary_type_t)local_88.update == dictionary_type_error_t || iVar1 != '\0') {
      return '\x04';
    }
    ion_switch_handler((ion_dictionary_type_t)local_88.update,&local_88);
    iVar1 = dictionary_destroy_dictionary(&local_88,id);
    if (iVar1 != '\0') {
      return iVar1;
    }
    config = (ion_dictionary_handler_t *)&local_38;
    local_38.value_size = 0;
    local_38.dictionary_size = 0;
    local_38.dictionary_type = dictionary_type_bpp_tree_t;
    local_38.dictionary_status = '\0';
    local_38._29_3_ = 0;
    local_38.id = 0;
    local_38.use_type = '\0';
    local_38._5_3_ = 0;
    local_38.type = key_type_numeric_signed;
    local_38.key_size = 0;
  }
  else {
    uVar2 = (ulong)dictionary->instance->id;
    iVar1 = dictionary_delete_dictionary(dictionary);
    if (iVar1 != '\0') {
      return '\x04';
    }
    local_88.get = (_func_ion_status_t_ion_dictionary_t_ptr_ion_key_t_ion_value_t *)0x0;
    local_88.update = (_func_ion_status_t_ion_dictionary_t_ptr_ion_key_t_ion_value_t *)0x0;
    local_88.insert = (_func_ion_status_t_ion_dictionary_t_ptr_ion_key_t_ion_value_t *)0x0;
    local_88.create_dictionary =
         (_func_ion_err_t_ion_dictionary_id_t_ion_key_type_t_ion_key_size_t_ion_value_size_t_ion_dictionary_size_t_ion_dictionary_compare_t_ion_dictionary_handler_t_ptr_ion_dictionary_t_ptr
          *)0x0;
  }
  iVar1 = ion_master_table_write((ion_dictionary_config_info_t *)config,uVar2 * 0x1a);
  return iVar1;
}

Assistant:

ion_err_t
ion_delete_dictionary(
	ion_dictionary_t	*dictionary,
	ion_dictionary_id_t id
) {
	ion_err_t				err;
	ion_dictionary_type_t	type;

	if (ion_dictionary_status_closed != dictionary->status) {
		id	= dictionary->instance->id;
		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err_dictionary_destruction_error;
		}

		err = ion_delete_from_master_table(id);
	}
	else {
		type = ion_get_dictionary_type(id);

		if (dictionary_type_error_t == type) {
			return err_dictionary_destruction_error;
		}

		ion_dictionary_handler_t handler;

		ion_switch_handler(type, &handler);

		err = dictionary_destroy_dictionary(&handler, id);

		if (err_ok != err) {
			return err;
		}

		err = ion_delete_from_master_table(id);
	}

	return err;
}